

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

CheckedError __thiscall flatbuffers::Parser::ParseProtoCurliesOrIdent(Parser *this)

{
  char cVar1;
  int iVar2;
  int iVar3;
  long in_RSI;
  
  iVar3 = *(int *)(in_RSI + 0x1c);
  Next(this);
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  cVar1 = *(char *)&(this->super_ParserState).prev_cursor_;
  if (iVar3 == 0x7b) {
    if (cVar1 != '\0') goto LAB_0011bb4b;
    iVar3 = 1;
    do {
      iVar2 = iVar3;
      if (iVar2 == 0) goto LAB_0011bb46;
      if (*(int *)(in_RSI + 0x1c) == 0x7d) {
        iVar3 = iVar2 + -1;
      }
      else {
        iVar3 = iVar2;
        if (*(int *)(in_RSI + 0x1c) == 0x7b) {
          iVar3 = iVar2 + 1;
        }
      }
      Next(this);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    } while (*(char *)&(this->super_ParserState).prev_cursor_ != '\x01');
    if (iVar2 != 0) goto LAB_0011bb4b;
  }
  else if (cVar1 != '\0') goto LAB_0011bb4b;
LAB_0011bb46:
  *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
LAB_0011bb4b:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseProtoCurliesOrIdent() {
  if (Is('{')) {
    NEXT();
    for (int nesting = 1; nesting;) {
      if (token_ == '{')
        nesting++;
      else if (token_ == '}')
        nesting--;
      NEXT();
    }
  } else {
    NEXT();  // Any single token.
  }
  return NoError();
}